

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSObjectFactory.cpp
# Opt level: O2

XSWildcard * __thiscall
xercesc_4_0::XSObjectFactory::createXSWildcard
          (XSObjectFactory *this,ContentSpecNode *rootNode,XSModel *xsModel)

{
  XSWildcard *this_00;
  XSAnnotation *annot;
  XSObjectFactory *this_01;
  
  this_01 = (XSObjectFactory *)0x40;
  this_00 = (XSWildcard *)XMemory::operator_new(0x40,this->fMemoryManager);
  annot = getAnnotationFromModel(this_01,xsModel,rootNode);
  XSWildcard::XSWildcard(this_00,rootNode,annot,xsModel,this->fMemoryManager);
  BaseRefVectorOf<xercesc_4_0::XSObject>::addElement
            (&this->fDeleteVector->super_BaseRefVectorOf<xercesc_4_0::XSObject>,(XSObject *)this_00)
  ;
  return this_00;
}

Assistant:

XSWildcard*
XSObjectFactory::createXSWildcard(const ContentSpecNode* const rootNode,
                                  XSModel* const xsModel)
{
    XSWildcard* xsWildcard = new (fMemoryManager) XSWildcard
    (
        rootNode
        , getAnnotationFromModel(xsModel, rootNode)
        , xsModel
        , fMemoryManager
    );
    fDeleteVector->addElement(xsWildcard);

    return xsWildcard;
}